

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleUndefDirective(Preprocessor *this,Token directive)

{
  UndefDirectiveSyntax *syntax;
  Token nameToken;
  Token local_38;
  Token local_28;
  Trivia local_18;
  
  local_28.info = directive.info;
  local_28._0_8_ = directive._0_8_;
  local_38 = expect(this,Identifier);
  if ((local_38._0_4_ >> 0x10 & 1) == 0) {
    handleUndefDirective();
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UndefDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_28,&local_38);
  Trivia::Trivia(&local_18,Directive,(SyntaxNode *)syntax);
  return local_18;
}

Assistant:

Trivia Preprocessor::handleUndefDirective(Token directive) {
    Token nameToken = expect(TokenKind::Identifier);

    if (!nameToken.isMissing()) {
        std::string_view name = nameToken.valueText();
        auto it = macros.find(name);
        if (it != macros.end()) {
            if (!it->second.builtIn)
                macros.erase(it);
            else
                addDiag(diag::UndefineBuiltinDirective, nameToken.range());
        }
    }

    auto result = alloc.emplace<UndefDirectiveSyntax>(directive, nameToken);
    return Trivia(TriviaKind::Directive, result);
}